

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O1

void test_cpp_add_many_64(void **param_1)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  pointer puVar3;
  bool bVar4;
  uint64_t *puVar5;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_long> __l_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  Roaring64Map r2;
  Roaring64Map r1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_c0;
  Roaring64Map local_a8;
  Roaring64Map local_68;
  
  local_68.roarings._M_t._M_impl._0_8_ = 0x7b0000270f;
  local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = ~_S_red;
  local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0xfffffff7;
  local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x270f00000000;
  __l._M_len = 6;
  __l._M_array = (iterator)&local_68;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_c0,__l,(allocator_type *)&local_a8);
  p_Var1 = &local_68.roarings._M_t._M_impl.super__Rb_tree_header;
  local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68.roarings._M_t._M_impl._0_8_ = 0;
  local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68.copyOnWrite = false;
  local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  roaring::Roaring64Map::addMany
            (&local_68,
             (long)local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2,
             local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start);
  puVar3 = local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  p_Var2 = &local_a8.roarings._M_t._M_impl.super__Rb_tree_header;
  local_a8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8.roarings._M_t._M_impl._0_8_ = 0;
  local_a8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_a8.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8.copyOnWrite = false;
  local_a8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_a8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  if (local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    puVar5 = (uint64_t *)
             local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      roaring::Roaring64Map::add(&local_a8,(uint32_t)*puVar5);
      puVar5 = (uint64_t *)((long)puVar5 + 4);
    } while (puVar5 != (uint64_t *)puVar3);
  }
  bVar4 = roaring::Roaring64Map::operator==(&local_68,&local_a8);
  _assert_true((ulong)bVar4,"r1 == r2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x3e3);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&local_a8);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&local_68);
  if ((uint64_t *)
      local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint64_t *)0x0) {
    operator_delete(local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  local_68.roarings._M_t._M_impl._0_8_ = 0x22b0000270f;
  local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 0x7b;
  local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 1;
  local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x1ffffffff;
  local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x22bfffffff7;
  local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0x22b0000270f;
  __l_00._M_len = 6;
  __l_00._M_array = (iterator)&local_68;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_c0,__l_00,
             (allocator_type *)&local_a8);
  local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68.roarings._M_t._M_impl._0_8_ = 0;
  local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68.copyOnWrite = false;
  local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_68.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  roaring::Roaring64Map::addMany
            (&local_68,
             (long)local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,
             (uint64_t *)
             local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start);
  local_a8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8.roarings._M_t._M_impl._0_8_ = 0;
  local_a8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_a8.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8.copyOnWrite = false;
  local_a8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_a8.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  if (local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    puVar5 = (uint64_t *)
             local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      roaring::Roaring64Map::add(&local_a8,*puVar5);
      puVar5 = puVar5 + 1;
    } while (puVar5 != (uint64_t *)
                       local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  bVar4 = roaring::Roaring64Map::operator==(&local_68,&local_a8);
  _assert_true((ulong)bVar4,"r1 == r2",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0x3f2);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&local_a8);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&local_68);
  if ((uint64_t *)
      local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint64_t *)0x0) {
    operator_delete(local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

DEFINE_TEST(test_cpp_add_many_64) {
    {
        // 32-bit integers
        std::vector<uint32_t> values = {9999,       123, 0xFFFFFFFF,
                                        0xFFFFFFF7, 0,   9999};
        Roaring64Map r1;
        r1.addMany(values.size(), values.data());
        Roaring64Map r2;
        for (const auto value : values) {
            r2.add(value);
        }
        assert_true(r1 == r2);
    }

    auto b1 = uint64_t(1) << 32;
    auto b555 = uint64_t(555) << 32;

    std::vector<uint64_t> values = {
        b555 + 9999,       b1 + 123, b1 + 0xFFFFFFFF,
        b555 + 0xFFFFFFF7, 0,        b555 + 9999};
    Roaring64Map r1;
    r1.addMany(values.size(), values.data());
    Roaring64Map r2;
    for (const auto value : values) {
        r2.add(value);
    }
    assert_true(r1 == r2);
}